

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

ssize_t __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::write
          (arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
           *this,int __fd,void *__buf,size_t __n)

{
  format_error *this_00;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  basic_string_view<char> local_40;
  size_t local_30;
  size_t length;
  char_type *local_18;
  char_type *value_local;
  arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
  *this_local;
  
  local_18 = (char_type *)CONCAT44(in_register_00000034,__fd);
  value_local = (char_type *)this;
  if (local_18 == (char_type *)0x0) {
    this_00 = (format_error *)__cxa_allocate_exception(0x10);
    format_error::format_error(this_00,"string pointer is null");
    __cxa_throw(this_00,&format_error::typeinfo,format_error::~format_error);
  }
  local_30 = std::char_traits<char>::length(local_18);
  basic_string_view<char>::basic_string_view(&local_40,local_18,local_30);
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::write_str<char>
            (&this->writer_,local_40,this->specs_);
  return extraout_RAX;
}

Assistant:

void write(const char_type *value) {
    if (!value)
      FMT_THROW(format_error("string pointer is null"));
    auto length = std::char_traits<char_type>::length(value);
    writer_.write_str(basic_string_view<char_type>(value, length), specs_);
  }